

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  GetterXsYs<double> *pGVar6;
  TransformerLogLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  double dVar11;
  double dVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar5 = pGVar6->Count;
  lVar17 = (long)(((prim * 2 + pGVar6->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride;
  dVar1 = *(double *)((long)pGVar6->Ys + lVar17);
  dVar11 = log10(*(double *)((long)pGVar6->Xs + lVar17) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar15->LogDenX;
  pIVar8 = pIVar15->CurrentPlot;
  dVar3 = (pIVar8->XAxis).Range.Min;
  dVar4 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10(dVar1 / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar5 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar5].Range.Min;
  fVar21 = (float)((((double)(float)(dVar11 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar8->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar5].Min.x);
  fVar18 = (float)((((double)(float)(dVar12 / pIVar15->LogDenY[iVar5]) *
                     (pIVar8->YAxis[iVar5].Range.Max - dVar1) + dVar1) - dVar1) * pIVar15->My[iVar5]
                  + (double)pIVar15->PixelRange[iVar5].Min.y);
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar5 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim * 2 + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride;
  dVar1 = *(double *)((long)pGVar6->Ys + lVar17);
  dVar11 = log10(*(double *)((long)pGVar6->Xs + lVar17) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar8 = pIVar16->CurrentPlot;
  dVar3 = (pIVar8->XAxis).Range.Min;
  dVar4 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10(dVar1 / pIVar8->YAxis[pTVar7->YAxis].Range.Min);
  iVar5 = pTVar7->YAxis;
  pIVar8 = pIVar16->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar5].Range.Min;
  fVar20 = (float)((((double)(float)(dVar11 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar8->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar5].Min.x);
  fVar19 = (float)((((double)(float)(dVar12 / pIVar16->LogDenY[iVar5]) *
                     (pIVar8->YAxis[iVar5].Range.Max - dVar1) + dVar1) - dVar1) * pIVar16->My[iVar5]
                  + (double)pIVar16->PixelRange[iVar5].Min.y);
  IVar14.y = fVar18;
  IVar14.x = fVar21;
  DrawList->_VtxWritePtr->pos = IVar14;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  pIVar9[1].pos.x = fVar21;
  pIVar9[1].pos.y = fVar19;
  pIVar9[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  IVar13.y = fVar19;
  IVar13.x = fVar20;
  pIVar9[2].pos = IVar13;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos.x = fVar20;
  pIVar9[3].pos.y = fVar18;
  pIVar9[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 4;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = DrawList->_VtxCurrentIdx;
  puVar10[1] = DrawList->_VtxCurrentIdx + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = DrawList->_VtxCurrentIdx + 2;
  puVar10[5] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P1 = Transformer(Getter(2*prim));
        ImVec2 P2 = Transformer(Getter(2*prim+1));
        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = Col;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = Col;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = Col;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = Col;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }